

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void findOrCreateAggInfoColumn(Parse *pParse,AggInfo *pAggInfo,Expr *pExpr)

{
  short sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 *puVar4;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  Expr *pE;
  ExprList_item *pTerm;
  ExprList *pGB;
  int n;
  int j;
  int k;
  AggInfo_col *pCol;
  AggInfo *in_stack_ffffffffffffffb8;
  sqlite3 *in_stack_ffffffffffffffc0;
  int *piVar5;
  int local_28;
  int local_24;
  long local_20;
  
  pcVar3 = (char *)CONCAT62(in_register_00000012,in_DX);
  local_20 = *(long *)(in_RSI + 0x18);
  for (local_24 = 0; local_24 < *(int *)(in_RSI + 0x20); local_24 = local_24 + 1) {
    if (*(char **)(local_20 + 8) == pcVar3) {
      return;
    }
    if (((*(int *)(local_20 + 0x10) == *(int *)(pcVar3 + 0x2c)) &&
        (*(short *)(local_20 + 0x14) == *(short *)(pcVar3 + 0x30))) && (*pcVar3 != -0x4d))
    goto LAB_002118fe;
    local_20 = local_20 + 0x18;
  }
  local_24 = addAggInfoColumn(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (-1 < local_24) {
    puVar4 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_24 * 0x18);
    *puVar4 = *(undefined8 *)(pcVar3 + 0x40);
    *(undefined4 *)(puVar4 + 2) = *(undefined4 *)(pcVar3 + 0x2c);
    *(undefined2 *)((long)puVar4 + 0x14) = *(undefined2 *)(pcVar3 + 0x30);
    *(undefined2 *)((long)puVar4 + 0x16) = 0xffff;
    puVar4[1] = pcVar3;
    if ((*(long *)(in_RSI + 0x10) != 0) && (*pcVar3 != -0x4d)) {
      piVar5 = *(int **)(in_RSI + 0x10) + 2;
      for (local_28 = 0; local_28 < **(int **)(in_RSI + 0x10); local_28 = local_28 + 1) {
        pcVar2 = *(char **)piVar5;
        if (((*pcVar2 == -0x58) && (*(int *)(pcVar2 + 0x2c) == *(int *)(pcVar3 + 0x2c))) &&
           (*(short *)(pcVar2 + 0x30) == *(short *)(pcVar3 + 0x30))) {
          *(short *)((long)puVar4 + 0x16) = (short)local_28;
          break;
        }
        piVar5 = piVar5 + 6;
      }
    }
    if (*(short *)((long)puVar4 + 0x16) < 0) {
      sVar1 = *(short *)(in_RSI + 2);
      *(short *)(in_RSI + 2) = sVar1 + 1;
      *(short *)((long)puVar4 + 0x16) = sVar1;
    }
LAB_002118fe:
    *(long *)(pcVar3 + 0x38) = in_RSI;
    if (*pcVar3 == -0x58) {
      *pcVar3 = -0x56;
    }
    *(short *)(pcVar3 + 0x32) = (short)local_24;
  }
  return;
}

Assistant:

static void findOrCreateAggInfoColumn(
  Parse *pParse,       /* Parsing context */
  AggInfo *pAggInfo,   /* The AggInfo object to search and/or modify */
  Expr *pExpr          /* Expr describing the column to find or insert */
){
  struct AggInfo_col *pCol;
  int k;

  assert( pAggInfo->iFirstReg==0 );
  pCol = pAggInfo->aCol;
  for(k=0; k<pAggInfo->nColumn; k++, pCol++){
    if( pCol->pCExpr==pExpr ) return;
    if( pCol->iTable==pExpr->iTable
     && pCol->iColumn==pExpr->iColumn
     && pExpr->op!=TK_IF_NULL_ROW
    ){
      goto fix_up_expr;
    }
  }
  k = addAggInfoColumn(pParse->db, pAggInfo);
  if( k<0 ){
    /* OOM on resize */
    assert( pParse->db->mallocFailed );
    return;
  }
  pCol = &pAggInfo->aCol[k];
  assert( ExprUseYTab(pExpr) );
  pCol->pTab = pExpr->y.pTab;
  pCol->iTable = pExpr->iTable;
  pCol->iColumn = pExpr->iColumn;
  pCol->iSorterColumn = -1;
  pCol->pCExpr = pExpr;
  if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
    int j, n;
    ExprList *pGB = pAggInfo->pGroupBy;
    struct ExprList_item *pTerm = pGB->a;
    n = pGB->nExpr;
    for(j=0; j<n; j++, pTerm++){
      Expr *pE = pTerm->pExpr;
      if( pE->op==TK_COLUMN
       && pE->iTable==pExpr->iTable
       && pE->iColumn==pExpr->iColumn
      ){
        pCol->iSorterColumn = j;
        break;
      }
    }
  }
  if( pCol->iSorterColumn<0 ){
    pCol->iSorterColumn = pAggInfo->nSortingColumn++;
  }
fix_up_expr:
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  assert( pExpr->pAggInfo==0 || pExpr->pAggInfo==pAggInfo );
  pExpr->pAggInfo = pAggInfo;
  if( pExpr->op==TK_COLUMN ){
    pExpr->op = TK_AGG_COLUMN;
  }
  pExpr->iAgg = (i16)k;
}